

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# piecewise_linear.cpp
# Opt level: O0

void __thiscall
mp::
BasicPLApproximator<mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<double,_1UL>,_mp::NumericFunctionalConstraintTraits,_mp::LogAId>_>
::IncreaseStepWhileErrorSmallEnough
          (BasicPLApproximator<mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<double,_1UL>,_mp::NumericFunctionalConstraintTraits,_mp::LogAId>_>
           *this,double x0,double f0,double *dx0)

{
  bool bVar1;
  int iVar2;
  double *in_RSI;
  long *in_RDI;
  double in_XMM0_Qa;
  double dVar3;
  double dVar4;
  double in_XMM1_Qa;
  double f1;
  
  while( true ) {
    dVar3 = (double)(**(code **)(*in_RDI + 0x48))(in_XMM0_Qa + *in_RSI);
    bVar1 = true;
    if ((dVar3 != in_XMM1_Qa) || (NAN(dVar3) || NAN(in_XMM1_Qa))) {
      iVar2 = (**(code **)(*in_RDI + 0xd8))(in_XMM0_Qa,in_XMM1_Qa,in_XMM0_Qa + *in_RSI,dVar3);
      bVar1 = iVar2 < 0;
    }
    if (!bVar1) break;
    *in_RSI = *in_RSI * 1.2;
    dVar3 = *in_RSI;
    dVar4 = ub_sub((BasicPLApproximator<mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<double,_1UL>,_mp::NumericFunctionalConstraintTraits,_mp::LogAId>_>
                    *)0x532750);
    if (dVar4 < in_XMM0_Qa + dVar3) {
      dVar3 = ub_sub((BasicPLApproximator<mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<double,_1UL>,_mp::NumericFunctionalConstraintTraits,_mp::LogAId>_>
                      *)0x532769);
      *in_RSI = dVar3 - in_XMM0_Qa;
      return;
    }
  }
  return;
}

Assistant:

void BasicPLApproximator<FuncCon>::IncreaseStepWhileErrorSmallEnough(
    double x0, double f0, double& dx0) {
  double f1;
  while ( (f1=eval(x0+dx0))==f0 ||           // same value
          0 > CompareError(x0, f0, x0+dx0, f1) ) {
    dx0 *= 1.2;
    if (x0+dx0 > ub_sub()) {
      dx0 = ub_sub()-x0;
      break;
    }
  }
}